

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

string_view __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::BaseIndicator
          (anon_unknown_53 *this,IntDigits *as_digits,FormatConversionSpecImpl conv)

{
  bool bVar1;
  FormatConversionChar FVar2;
  char *local_68;
  byte local_5b;
  bool local_5a;
  bool local_59;
  string_view local_58;
  bool local_42;
  bool local_41;
  bool hex;
  IntDigits *pIStack_40;
  bool alt;
  IntDigits *as_digits_local;
  undefined1 local_2c [8];
  undefined1 local_24 [8];
  FormatConversionSpecImpl conv_local;
  
  local_2c._0_4_ = conv._0_4_;
  pIStack_40 = (IntDigits *)this;
  unique0x10000154 = as_digits;
  local_24 = (undefined1  [8])as_digits;
  conv_local._0_4_ = local_2c._0_4_;
  bVar1 = FormatConversionSpecImpl::has_alt_flag((FormatConversionSpecImpl *)local_24);
  local_59 = true;
  if (!bVar1) {
    FVar2 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)local_24);
    local_59 = FVar2 == 0x11;
  }
  local_41 = local_59;
  FVar2 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)local_24);
  local_5a = true;
  if (FVar2 != 6) {
    FVar2 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)local_24);
    local_5a = true;
    if (FVar2 != 7) {
      FVar2 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)local_24);
      local_5a = FVar2 == 0x11;
    }
  }
  local_42 = local_5a;
  local_5b = 0;
  if (((local_41 & 1U) != 0) && (local_5b = 0, local_5a != false)) {
    local_58 = IntDigits::without_neg_or_zero(pIStack_40);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_58);
    local_5b = bVar1 ^ 0xff;
  }
  if ((local_5b & 1) == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&conv_local.width_);
  }
  else {
    FVar2 = FormatConversionSpecImpl::conversion_char((FormatConversionSpecImpl *)local_24);
    if (FVar2 == 7) {
      local_68 = "0X";
    }
    else {
      local_68 = "0x";
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&conv_local.width_,local_68);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

string_view BaseIndicator(const IntDigits &as_digits,
                          const FormatConversionSpecImpl conv) {
  // always show 0x for %p.
  bool alt = conv.has_alt_flag() ||
             conv.conversion_char() == FormatConversionCharInternal::p;
  bool hex = (conv.conversion_char() == FormatConversionCharInternal::x ||
              conv.conversion_char() == FormatConversionCharInternal::X ||
              conv.conversion_char() == FormatConversionCharInternal::p);
  // From the POSIX description of '#' flag:
  //   "For x or X conversion specifiers, a non-zero result shall have
  //   0x (or 0X) prefixed to it."
  if (alt && hex && !as_digits.without_neg_or_zero().empty()) {
    return conv.conversion_char() == FormatConversionCharInternal::X ? "0X"
                                                                     : "0x";
  }
  return {};
}